

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_java_meta_data_map(t_java_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  e_req eVar2;
  ostream *poVar3;
  reference pptVar4;
  string *psVar5;
  t_type *type;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68 [8];
  string field_name;
  t_field *field;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,
                           "public static final java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> metaDataMap;"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"static {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,
                           "java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> tmpMap = new java.util.EnumMap<_Fields, org.apache.thrift.meta_data.FieldMetaData>(_Fields.class);"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    field = (t_field *)
            std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                      ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&field);
    if (!bVar1) break;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    field_name.field_2._8_8_ = *pptVar4;
    psVar5 = t_field::get_name_abi_cxx11_((t_field *)field_name.field_2._8_8_);
    std::__cxx11::string::string(local_68,(string *)psVar5);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"tmpMap.put(_Fields.");
    std::__cxx11::string::string((string *)&local_b8,local_68);
    constant_name(&local_98,this,&local_b8);
    poVar3 = std::operator<<(poVar3,(string *)&local_98);
    poVar3 = std::operator<<(poVar3,", new org.apache.thrift.meta_data.FieldMetaData(\"");
    poVar3 = std::operator<<(poVar3,local_68);
    std::operator<<(poVar3,"\", ");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    eVar2 = t_field::get_req((t_field *)field_name.field_2._8_8_);
    if (eVar2 == T_REQUIRED) {
      std::operator<<(out,"org.apache.thrift.TFieldRequirementType.REQUIRED, ");
    }
    else {
      eVar2 = t_field::get_req((t_field *)field_name.field_2._8_8_);
      if (eVar2 == T_OPTIONAL) {
        std::operator<<(out,"org.apache.thrift.TFieldRequirementType.OPTIONAL, ");
      }
      else {
        std::operator<<(out,"org.apache.thrift.TFieldRequirementType.DEFAULT, ");
      }
    }
    type = t_field::get_type((t_field *)field_name.field_2._8_8_);
    generate_field_value_meta_data(this,out,type);
    poVar3 = std::operator<<(out,"));");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"metaDataMap = java.util.Collections.unmodifiableMap(tmpMap);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"org.apache.thrift.meta_data.FieldMetaData.addStructMetaDataMap(")
  ;
  type_name_abi_cxx11_(&local_d8,this,&tstruct->super_t_type,false,false,false,false);
  poVar3 = std::operator<<(poVar3,(string *)&local_d8);
  poVar3 = std::operator<<(poVar3,".class, metaDataMap);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d8);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_meta_data_map(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Static Map with fieldID -> org.apache.thrift.meta_data.FieldMetaData mappings
  indent(out)
      << "public static final java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> metaDataMap;"
      << endl;
  indent(out) << "static {" << endl;
  indent_up();

  indent(out) << "java.util.Map<_Fields, org.apache.thrift.meta_data.FieldMetaData> tmpMap = new "
                 "java.util.EnumMap<_Fields, org.apache.thrift.meta_data.FieldMetaData>(_Fields.class);"
              << endl;

  // Populate map
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = *f_iter;
    std::string field_name = field->get_name();
    indent(out) << "tmpMap.put(_Fields." << constant_name(field_name)
                << ", new org.apache.thrift.meta_data.FieldMetaData(\"" << field_name << "\", ";

    // Set field requirement type (required, optional, etc.)
    if (field->get_req() == t_field::T_REQUIRED) {
      out << "org.apache.thrift.TFieldRequirementType.REQUIRED, ";
    } else if (field->get_req() == t_field::T_OPTIONAL) {
      out << "org.apache.thrift.TFieldRequirementType.OPTIONAL, ";
    } else {
      out << "org.apache.thrift.TFieldRequirementType.DEFAULT, ";
    }

    // Create value meta data
    generate_field_value_meta_data(out, field->get_type());
    out << "));" << endl;
  }

  indent(out) << "metaDataMap = java.util.Collections.unmodifiableMap(tmpMap);" << endl;

  indent(out) << "org.apache.thrift.meta_data.FieldMetaData.addStructMetaDataMap("
              << type_name(tstruct) << ".class, metaDataMap);" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
}